

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decMan.c
# Opt level: O2

void Dec_ManStop(Dec_Man_t *p)

{
  Mvc_ManagerFree((Mvc_Manager_t *)p->pMvcMem);
  Vec_IntFree(p->vCubes);
  Vec_IntFree(p->vLits);
  if (p->puCanons != (unsigned_short *)0x0) {
    free(p->puCanons);
    p->puCanons = (unsigned_short *)0x0;
  }
  if (p->pPhases != (char *)0x0) {
    free(p->pPhases);
    p->pPhases = (char *)0x0;
  }
  if (p->pPerms != (char *)0x0) {
    free(p->pPerms);
    p->pPerms = (char *)0x0;
  }
  free(p->pMap);
  free(p);
  return;
}

Assistant:

void Dec_ManStop( Dec_Man_t * p )
{
    Mvc_ManagerFree( (Mvc_Manager_t *)p->pMvcMem );
    Vec_IntFree( p->vCubes );
    Vec_IntFree( p->vLits );
    ABC_FREE( p->puCanons );
    ABC_FREE( p->pPhases );
    ABC_FREE( p->pPerms );
    ABC_FREE( p->pMap );
    ABC_FREE( p );
}